

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

bool_t derIsValid(octet *der,size_t count)

{
  bool_t bVar1;
  size_t in_RSI;
  octet *in_RDI;
  size_t len;
  size_t l_count;
  size_t t_count;
  bool local_31;
  size_t local_30;
  size_t local_28;
  size_t local_20;
  size_t local_18;
  octet *local_10;
  uint local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = derTDec((u32 *)0x0,in_RDI,in_RSI);
  if (local_20 == 0xffffffffffffffff) {
    local_4 = 0;
  }
  else {
    local_28 = derLDec(&local_30,local_10 + local_20,local_18 - local_20);
    if (local_28 == 0xffffffffffffffff) {
      local_4 = 0;
    }
    else {
      local_31 = false;
      if (local_18 == local_20 + local_28 + local_30) {
        bVar1 = memIsValid(local_10 + local_28 + local_20,local_30);
        local_31 = bVar1 != 0;
      }
      local_4 = (uint)local_31;
    }
  }
  return local_4;
}

Assistant:

bool_t derIsValid(const octet der[], size_t count)
{
	size_t t_count;
	size_t l_count;
	size_t len;
	// обработать T
	t_count = derTDec(0, der, count);
	if (t_count == SIZE_MAX)
		return FALSE;
	// обработать L
	l_count = derLDec(&len, der + t_count, count - t_count);
	if (l_count == SIZE_MAX)
		return FALSE;
	// проверить V
	return count == t_count + l_count + len &&
		memIsValid(der + t_count + l_count, len);
}